

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ExpressionTemplateTest::arithmeticOperatorsTest(ExpressionTemplateTest *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  int iVar6;
  value_type vVar7;
  value_type vVar8;
  value_type vVar9;
  value_type vVar10;
  value_type vVar11;
  value_type vVar12;
  value_type vVar13;
  value_type vVar14;
  value_type vVar15;
  value_type vVar16;
  value_type vVar17;
  value_type vVar18;
  int *piVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  logic_error *plVar23;
  code *pcVar24;
  size_t sVar25;
  undefined *puVar26;
  View<int,_false,_std::allocator<unsigned_long>_> w;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  size_t shape [3];
  size_t local_170;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  local_160;
  size_t local_148;
  undefined1 local_140 [16];
  size_t *local_130;
  size_t local_118;
  undefined1 local_100 [16];
  size_t *local_f0;
  size_t local_d8;
  value_type local_bc;
  View<int,_false,_std::allocator<unsigned_long>_> *local_b8;
  undefined4 local_b0;
  unsigned_long local_a8 [3];
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_90;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_78;
  BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
  local_60;
  BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_48;
  
  local_a8[0] = 2;
  local_a8[1] = 3;
  local_a8[2] = 2;
  local_100._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_100 + 8),local_a8,
             (unsigned_long *)&local_90,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_140);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
  local_140._0_8_ = this->dataInt_ + 2;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_140 + 8),local_a8,
             (unsigned_long *)&local_90,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_160);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140);
  sVar25 = 0;
  do {
    local_170 = 0;
    local_148 = sVar25;
    do {
      sVar25 = 0;
      do {
        sVar22 = local_148;
        piVar19 = andres::
                  ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>::
                  operator()((ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                              *)local_100,sVar25,local_170,local_148);
        iVar6 = *piVar19;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013cc56:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        if (iVar6 != ((int *)uVar5)[sVar20 * sVar25 + sVar21]) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013cc56;
        }
        local_160.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        iVar6 = andres::
                UnaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                ::operator()((UnaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                              *)&local_160,sVar25,local_170,sVar22);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013ccb4:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        if (iVar6 + ((int *)uVar5)[sVar20 * sVar25 + sVar21] != 0) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013ccb4;
        }
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar7 = andres::
                BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()((BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                              *)&local_160,sVar25,local_170,sVar22);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013cd94:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        if (vVar7 != ((int *)uVar5)[sVar20 * sVar25 + sVar21] + 2) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013cd94;
        }
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar8 = andres::
                BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()((BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                              *)&local_160,sVar25,local_170,sVar22);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013ce27:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        if (vVar8 != ((int *)uVar5)[sVar20 * sVar25 + sVar21] + 2) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013ce27;
        }
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_160,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_100,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_140);
        vVar9 = andres::
                BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()(&local_160,sVar25,local_170,sVar22);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
LAB_0013ce4b:
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013ce59:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        iVar6 = ((int *)uVar5)[sVar20 * sVar25 + sVar21];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140);
        uVar5 = local_140._0_8_;
        if (((int *)local_140._0_8_ == (int *)0x0) || (local_118 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          goto LAB_0013ce4b;
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,3,
                            local_170,sVar22);
        if (vVar9 != iVar6 + *(int *)(uVar5 + (sVar20 * sVar25 + sVar21) * 4)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013ce59;
        }
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar10 = andres::
                 BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                               *)&local_160,sVar25,local_170,sVar22);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013ce8b:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        if (vVar10 != 2 - ((int *)uVar5)[sVar20 * sVar25 + sVar21]) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013ce8b;
        }
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar11 = andres::
                 BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                               *)&local_160,sVar25,local_170,sVar22);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013cdf5:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        if (vVar11 != ((int *)uVar5)[sVar20 * sVar25 + sVar21] + -2) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013cdf5;
        }
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                    *)&local_160,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_100,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_140);
        vVar12 = andres::
                 BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                 ::operator()((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                               *)&local_160,sVar25,local_170,sVar22);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
LAB_0013d043:
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013d051:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        iVar6 = ((int *)uVar5)[sVar20 * sVar25 + sVar21];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140);
        uVar5 = local_140._0_8_;
        if (((int *)local_140._0_8_ == (int *)0x0) || (local_118 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          goto LAB_0013d043;
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,3,
                            local_170,sVar22);
        if (vVar12 != iVar6 - *(int *)(uVar5 + (sVar20 * sVar25 + sVar21) * 4)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013d051;
        }
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar13 = andres::
                 BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                               *)&local_160,sVar25,local_170,sVar22);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013d01f:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        if (vVar13 != ((int *)uVar5)[sVar20 * sVar25 + sVar21] * 2) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013d01f;
        }
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar14 = andres::
                 BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                               *)&local_160,sVar25,local_170,sVar22);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013cf9a:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        if (vVar14 != ((int *)uVar5)[sVar20 * sVar25 + sVar21] * 2) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013cf9a;
        }
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                    *)&local_160,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_100,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_140);
        vVar15 = andres::
                 BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::operator()((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                               *)&local_160,sVar25,local_170,sVar22);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
LAB_0013cfdf:
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013cfed:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        iVar6 = ((int *)uVar5)[sVar20 * sVar25 + sVar21];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140);
        uVar5 = local_140._0_8_;
        if (((int *)local_140._0_8_ == (int *)0x0) || (local_118 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          goto LAB_0013cfdf;
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,3,
                            local_170,sVar22);
        if (vVar15 != iVar6 * *(int *)(uVar5 + (sVar20 * sVar25 + sVar21) * 4)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013cfed;
        }
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar16 = andres::
                 BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                               *)&local_160,sVar25,local_170,sVar22);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013d1aa:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        if (vVar16 != (int)(2 / (long)((int *)uVar5)[sVar20 * sVar25 + sVar21])) {
          plVar23 = (logic_error *)
                    __cxa_allocate_exception
                              (0x10,sVar25,
                               2 % (long)((int *)uVar5)[sVar20 * sVar25 + sVar21] & 0xffffffff);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013d1aa;
        }
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar17 = andres::
                 BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                               *)&local_160,sVar25,local_170,sVar22);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013d0af:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        if (vVar17 != ((int *)uVar5)[sVar20 * sVar25 + sVar21] / 2) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013d0af;
        }
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                    *)&local_160,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_100,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_140);
        vVar18 = andres::
                 BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                 ::operator()((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                               *)&local_160,sVar25,local_170,sVar22);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
LAB_0013d16a:
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013d178:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,sVar22);
        iVar6 = ((int *)uVar5)[sVar20 * sVar25 + sVar21];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140);
        uVar5 = local_140._0_8_;
        if (((int *)local_140._0_8_ == (int *)0x0) || (local_118 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          goto LAB_0013d16a;
        }
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,3,
                            local_170,sVar22);
        iVar1 = ((int *)(uVar5 + sVar20 * sVar25 * 4))[sVar22];
        if (vVar18 != iVar6 / iVar1) {
          plVar23 = (logic_error *)
                    __cxa_allocate_exception
                              (0x10,(int *)(uVar5 + sVar20 * sVar25 * 4),
                               (long)iVar6 % (long)iVar1 & 0xffffffff);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013d178;
        }
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_78,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_100,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_100);
        local_b0 = 2;
        local_b8 = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        andres::
        BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_48,
                   (ViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                    *)&local_b8,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_140);
        andres::
        BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_60,
                   (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                    *)&local_78,
                   (ViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                    *)&local_48);
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_90,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_140,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_140);
        andres::
        BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                    *)&local_160,
                   (ViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int>
                    *)&local_60,
                   (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                    *)&local_90);
        local_bc = andres::
                   BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                   ::operator()((BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                                 *)&local_160,sVar25,local_170,local_148);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
LAB_0013d278:
          pcVar24 = std::runtime_error::~runtime_error;
          puVar26 = &std::runtime_error::typeinfo;
LAB_0013d286:
          __cxa_throw(plVar23,puVar26,pcVar24);
        }
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,local_148);
        iVar6 = ((int *)uVar5)[sVar22 * sVar25 + sVar20];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          goto LAB_0013d278;
        }
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,local_148);
        iVar1 = ((int *)uVar5)[sVar22 * sVar25 + sVar20];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar5 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          goto LAB_0013d278;
        }
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_170,local_148);
        iVar2 = ((int *)uVar5)[sVar22 * sVar25 + sVar20];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140);
        uVar5 = local_140._0_8_;
        if (((int *)local_140._0_8_ == (int *)0x0) || (local_118 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          goto LAB_0013d278;
        }
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,0);
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,3,
                            local_170,local_148);
        iVar3 = *(int *)(uVar5 + (sVar22 * sVar25 + sVar20) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140);
        uVar5 = local_140._0_8_;
        if (((int *)local_140._0_8_ == (int *)0x0) || (local_118 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          goto LAB_0013d278;
        }
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,0);
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,3,
                            local_170,local_148);
        iVar4 = *(int *)(uVar5 + (sVar22 * sVar25 + sVar20) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140);
        uVar5 = local_140._0_8_;
        if (((int *)local_140._0_8_ == (int *)0x0) || (local_118 != 3)) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar23,"Assertion failed.");
          goto LAB_0013d278;
        }
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,0);
        sVar20 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_140,3,
                            local_170,local_148);
        if (local_bc !=
            iVar4 * *(int *)(uVar5 + (sVar22 * sVar25 + sVar20) * 4) +
            iVar6 * iVar1 + iVar2 * iVar3 * -2) {
          plVar23 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar23,"test failed.");
          pcVar24 = std::logic_error::~logic_error;
          puVar26 = &std::logic_error::typeinfo;
          goto LAB_0013d286;
        }
        sVar25 = sVar25 + 1;
      } while (sVar25 == 1);
      local_170 = local_170 + 1;
    } while (local_170 != 3);
    sVar25 = local_148 + 1;
    if (local_148 != 0) {
      operator_delete(local_130,local_118 * 0x18);
      operator_delete(local_f0,local_d8 * 0x18);
      return;
    }
  } while( true );
}

Assistant:

void ExpressionTemplateTest::arithmeticOperatorsTest()
{
    std::size_t shape[] = {2, 3, 2};
    andres::View<int> v(shape, shape+3, dataInt_);
    andres::View<int> w(shape, shape+3, dataInt_ + 2);
    for(std::size_t z=0; z<2; ++z) {
        for(std::size_t y=0; y<3; ++y) {
            for(std::size_t x=0; x<2; ++x) {
                test((+v)(x,y,z) == + v(x,y,z));

                test((-v)(x,y,z) == - v(x,y,z));

                test((2+v)(x,y,z) == 2 + v(x,y,z));
                test((v+2)(x,y,z) == v(x,y,z) + 2);
                test((v+w)(x,y,z) == v(x,y,z) + w(x,y,z));

                test((2-v)(x,y,z) == 2 - v(x,y,z));
                test((v-2)(x,y,z) == v(x,y,z) - 2);
                test((v-w)(x,y,z) == v(x,y,z) - w(x,y,z));

                test((2*v)(x,y,z) == 2 * v(x,y,z));
                test((v*2)(x,y,z) == v(x,y,z) * 2);
                test((v*w)(x,y,z) == v(x,y,z) * w(x,y,z));

                test((2/v)(x,y,z) == 2 / v(x,y,z));
                test((v/2)(x,y,z) == v(x,y,z) / 2);
                test((v/w)(x,y,z) == v(x,y,z) / w(x,y,z));

                test((v*v - 2*v*w + w*w)(x,y,z)
                    == v(x,y,z)*v(x,y,z) - 2*v(x,y,z)*w(x,y,z)
                       + w(x,y,z)*w(x,y,z));
            }
        }
    }
}